

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O3

void __thiscall imrt::EvaluationFunction::generate_voxel_dose_functions(EvaluationFunction *this)

{
  pointer pvVar1;
  pointer __s;
  pointer pdVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  long *plVar6;
  ostream *poVar7;
  _Rb_tree_node_base *p_Var8;
  undefined8 *puVar9;
  long lVar10;
  ulong uVar11;
  long *plVar12;
  long lVar13;
  _Base_ptr *pp_Var14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  string __str_1;
  set<double,_std::greater<double>,_std::allocator<double>_> dose;
  string __str;
  ofstream myfile;
  long *local_2d8;
  long local_2d0;
  long local_2c8;
  long lStack_2c0;
  long *local_2b8;
  long local_2b0;
  long local_2a8;
  long lStack_2a0;
  double local_298;
  _Rb_tree<double,_double,_std::_Identity<double>,_std::greater<double>,_std::allocator<double>_>
  local_290;
  undefined8 local_260;
  long local_258;
  char *local_250 [2];
  char local_240 [16];
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  if (0 < this->nb_organs) {
    local_258 = _VTT;
    local_260 = __filebuf;
    uVar16 = 0;
    do {
      local_290._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_290._M_impl.super__Rb_tree_header._M_header;
      local_290._M_impl.super__Rb_tree_header._M_header._0_8_ =
           local_290._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
      local_290._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_290._M_impl.super__Rb_tree_header._M_node_count = 0;
      pvVar1 = (this->voxel_dose).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __s = pvVar1[uVar16].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
      pdVar2 = *(pointer *)
                ((long)&pvVar1[uVar16].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data + 8);
      local_290._M_impl.super__Rb_tree_header._M_header._M_right =
           local_290._M_impl.super__Rb_tree_header._M_header._M_left;
      if (__s != pdVar2) {
        memset(__s,0,((long)pdVar2 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
      }
      if (0 < (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar16]) {
        lVar18 = *(long *)&(this->Z).
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar16].
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data;
        lVar13 = 0;
        lVar15 = 0;
        do {
          std::
          _Rb_tree<double,double,std::_Identity<double>,std::greater<double>,std::allocator<double>>
          ::_M_insert_unique<double_const&>
                    ((_Rb_tree<double,double,std::_Identity<double>,std::greater<double>,std::allocator<double>>
                      *)&local_290,(double *)(lVar18 + lVar13));
          lVar18 = *(long *)&(this->Z).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar16].
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data;
          if (*(double *)(lVar18 + lVar13) < 150.0) {
            lVar10 = (long)(int)*(double *)(lVar18 + lVar13);
            lVar3 = *(long *)&(this->voxel_dose).
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar16].
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data;
            *(double *)(lVar3 + lVar10 * 8) = *(double *)(lVar3 + lVar10 * 8) + 1.0;
          }
          lVar15 = lVar15 + 1;
          lVar13 = lVar13 + 8;
        } while (lVar15 < (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar16]);
      }
      std::ofstream::ofstream((string *)&local_230);
      uVar17 = 1;
      if (9 < uVar16) {
        uVar4 = 4;
        uVar11 = uVar16;
        do {
          uVar17 = uVar4;
          uVar5 = (uint)uVar11;
          if (uVar5 < 100) {
            uVar17 = uVar17 - 2;
            goto LAB_00129d86;
          }
          if (uVar5 < 1000) {
            uVar17 = uVar17 - 1;
            goto LAB_00129d86;
          }
          if (uVar5 < 10000) goto LAB_00129d86;
          uVar11 = (uVar11 & 0xffffffff) / 10000;
          uVar4 = uVar17 + 4;
        } while (99999 < uVar5);
        uVar17 = uVar17 + 1;
      }
LAB_00129d86:
      local_250[0] = local_240;
      std::__cxx11::string::_M_construct((ulong)local_250,(char)uVar17);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_250[0],uVar17,(uint)uVar16);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)local_250,0,(char *)0x0,0x12e4cc);
      plVar12 = plVar6 + 2;
      if ((long *)*plVar6 == plVar12) {
        local_2c8 = *plVar12;
        lStack_2c0 = plVar6[3];
        local_2d8 = &local_2c8;
      }
      else {
        local_2c8 = *plVar12;
        local_2d8 = (long *)*plVar6;
      }
      local_2d0 = plVar6[1];
      *plVar6 = (long)plVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_2d8);
      plVar12 = plVar6 + 2;
      if ((long *)*plVar6 == plVar12) {
        local_2a8 = *plVar12;
        lStack_2a0 = plVar6[3];
        local_2b8 = &local_2a8;
      }
      else {
        local_2a8 = *plVar12;
        local_2b8 = (long *)*plVar6;
      }
      local_2b0 = plVar6[1];
      *plVar6 = (long)plVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_2b8);
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8);
      }
      if (local_2d8 != &local_2c8) {
        operator_delete(local_2d8);
      }
      p_Var8 = local_290._M_impl.super__Rb_tree_header._M_header._M_left;
      if (local_250[0] != local_240) {
        operator_delete(local_250[0]);
        p_Var8 = local_290._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      for (; (_Rb_tree_header *)p_Var8 != &local_290._M_impl.super__Rb_tree_header;
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
        poVar7 = std::ostream::_M_insert<double>(*(double *)(p_Var8 + 1));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
      }
      std::ofstream::close();
      local_230 = local_258;
      *(undefined8 *)(local_228 + *(long *)(local_258 + -0x18) + -8) = local_260;
      std::filebuf::~filebuf(local_228);
      std::ios_base::~ios_base(local_138);
      std::
      _Rb_tree<double,_double,_std::_Identity<double>,_std::greater<double>,_std::allocator<double>_>
      ::~_Rb_tree(&local_290);
      uVar16 = uVar16 + 1;
    } while ((long)uVar16 < (long)this->nb_organs);
    if (0 < this->nb_organs) {
      uVar16 = 0;
      do {
        pp_Var14 = &local_290._M_impl.super__Rb_tree_header._M_header._M_parent;
        std::ofstream::ofstream((string *)&local_230);
        uVar17 = 1;
        if (9 < uVar16) {
          uVar4 = 4;
          uVar11 = uVar16;
          do {
            uVar17 = uVar4;
            uVar5 = (uint)uVar11;
            if (uVar5 < 100) {
              uVar17 = uVar17 - 2;
              goto LAB_00129fe0;
            }
            if (uVar5 < 1000) {
              uVar17 = uVar17 - 1;
              goto LAB_00129fe0;
            }
            if (uVar5 < 10000) goto LAB_00129fe0;
            uVar11 = (uVar11 & 0xffffffff) / 10000;
            uVar4 = uVar17 + 4;
          } while (99999 < uVar5);
          uVar17 = uVar17 + 1;
        }
LAB_00129fe0:
        local_2d8 = &local_2c8;
        std::__cxx11::string::_M_construct((ulong)&local_2d8,(char)uVar17);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_2d8,uVar17,(uint)uVar16);
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,0x12e4e3);
        plVar6 = puVar9 + 2;
        if ((long *)*puVar9 == plVar6) {
          local_2a8 = *plVar6;
          lStack_2a0 = puVar9[3];
          local_2b8 = &local_2a8;
        }
        else {
          local_2a8 = *plVar6;
          local_2b8 = (long *)*puVar9;
        }
        local_2b0 = puVar9[1];
        *puVar9 = plVar6;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_2b8);
        plVar12 = plVar6 + 2;
        if ((_Base_ptr *)*plVar6 == (_Base_ptr *)plVar12) {
          local_290._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
          local_290._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar6[3];
          local_290._M_impl._0_8_ = pp_Var14;
        }
        else {
          local_290._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar12;
          local_290._M_impl._0_8_ = (_Base_ptr *)*plVar6;
        }
        local_290._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::ofstream::open((string *)&local_230,(_Ios_Openmode)&local_290);
        if ((_Base_ptr *)local_290._M_impl._0_8_ != pp_Var14) {
          operator_delete((void *)local_290._M_impl._0_8_);
        }
        if (local_2b8 != &local_2a8) {
          operator_delete(local_2b8);
        }
        if (local_2d8 != &local_2c8) {
          operator_delete(local_2d8);
        }
        local_298 = 0.0;
        lVar18 = 0x96;
        do {
          local_298 = local_298 +
                      *(double *)
                       (*(long *)&(this->voxel_dose).
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar16].
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data + -8 + lVar18 * 8);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_230,(int)lVar18);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
          poVar7 = std::ostream::_M_insert<double>
                             (local_298 /
                              (double)(this->nb_voxels).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start[uVar16]);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          lVar18 = lVar18 + -1;
        } while (lVar18 != 0);
        std::ofstream::close();
        local_230 = local_258;
        *(undefined8 *)(local_228 + *(long *)(local_258 + -0x18) + -8) = local_260;
        std::filebuf::~filebuf(local_228);
        std::ios_base::~ios_base(local_138);
        uVar16 = uVar16 + 1;
      } while ((long)uVar16 < (long)this->nb_organs);
    }
  }
  return;
}

Assistant:

void EvaluationFunction::generate_voxel_dose_functions (){

	for(int o=0; o<nb_organs; o++){
		std::set<double, std::greater<double> > dose;
		std::fill(voxel_dose[o].begin(), voxel_dose[o].end(), 0.0);
		for(int k=0; k<nb_voxels[o]; k++){

			dose.insert(Z[o][k]);
			if(Z[o][k]<150)
				voxel_dose[o][(int) Z[o][k]]+=1;
		}

		ofstream myfile;
		myfile.open ("plotter/organ_xls"+std::to_string(o)+".dat");
		for(auto v:dose){
			myfile << v << endl;
		}
		myfile.close();

	}


	for(int o=0; o<nb_organs; o++){
		ofstream myfile;
		myfile.open ("plotter/organ"+std::to_string(o)+".txt");

		double cum=0.0;
		for(int k=149; k>=0; k--){
			cum+= voxel_dose[o][k];
			myfile << k+1 << "," << cum/nb_voxels[o] << endl;
		}

		myfile.close();
	}
}